

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall
Imf_2_5::Header::Header
          (Header *this,int width,int height,Box2i *dataWindow,float pixelAspectRatio,
          V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
          Compression compression)

{
  int in_EDX;
  int in_ESI;
  Vec2<int> *in_RDI;
  Box2i displayWindow;
  Compression in_stack_00000264;
  LineOrder in_stack_00000268;
  float in_stack_0000026c;
  V2f *in_stack_00000270;
  float in_stack_0000027c;
  Box2i *in_stack_00000280;
  Box2i *in_stack_00000288;
  Header *in_stack_00000290;
  Vec2<int> *minT;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffffa0;
  Vec2<int> local_54 [8];
  int local_10;
  int local_c;
  
  in_RDI[4].x = 0;
  in_RDI[4].y = 0;
  in_RDI[5].x = 0;
  in_RDI[5].y = 0;
  in_RDI[2].x = 0;
  in_RDI[2].y = 0;
  in_RDI[3].x = 0;
  in_RDI[3].y = 0;
  in_RDI->x = 0;
  in_RDI->y = 0;
  in_RDI[1].x = 0;
  in_RDI[1].y = 0;
  minT = in_RDI;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  ::map((map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
         *)0x85a4f8);
  anon_unknown_1::sanityCheckDisplayWindow((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  staticInitialize();
  Imath_2_5::Vec2<int>::Vec2(local_54,0,0);
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffa4,local_c + -1,local_10 + -1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_stack_ffffffffffffffa0,minT,in_RDI);
  anon_unknown_1::initialize
            (in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_0000027c,
             in_stack_00000270,in_stack_0000026c,in_stack_00000268,in_stack_00000264);
  return;
}

Assistant:

Header::Header (int width,
		int height,
		const Box2i &dataWindow,
		float pixelAspectRatio,
		const V2f &screenWindowCenter,
		float screenWindowWidth,
		LineOrder lineOrder,
		Compression compression)
:
    _map()
{
    sanityCheckDisplayWindow (width, height);

    staticInitialize();

    Box2i displayWindow (V2i (0, 0), V2i (width - 1, height - 1));

    initialize (*this,
		displayWindow,
		dataWindow,
		pixelAspectRatio,
		screenWindowCenter,
		screenWindowWidth,
		lineOrder,
		compression);
}